

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::(anonymous_namespace)::PluginName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view plugin_prefix,
          string_view directive)

{
  AlphaNum *c;
  string_view directive_local;
  AlphaNum local_b8;
  AlphaNum local_88;
  _anonymous_namespace_ *local_58;
  size_t local_50;
  
  c = (AlphaNum *)directive._M_len;
  local_50 = plugin_prefix._M_len;
  directive_local._M_len = (size_t)plugin_prefix._M_str;
  directive_local._M_str = (char *)c;
  local_58 = this;
  local_88.piece_ = absl::lts_20250127::NullSafeStringView("gen-");
  local_b8.piece_ =
       std::basic_string_view<char,_std::char_traits<char>_>::substr
                 (&directive_local,2,(size_type)(plugin_prefix._M_str + -6));
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_58,&local_88,&local_b8,c);
  return __return_storage_ptr__;
}

Assistant:

std::string PluginName(absl::string_view plugin_prefix,
                       absl::string_view directive) {
  // Assuming the directive starts with "--" and ends with "_out" or "_opt",
  // strip the "--" and "_out/_opt" and add the plugin prefix.
  return absl::StrCat(plugin_prefix, "gen-",
                      directive.substr(2, directive.size() - 6));
}